

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O0

Map_NodeVec_t * Map_MappingDfs(Map_Man_t *pMan,int fCollectEquiv)

{
  Map_NodeVec_t *vNodes_00;
  int local_24;
  int i;
  Map_NodeVec_t *vNodes;
  int fCollectEquiv_local;
  Map_Man_t *pMan_local;
  
  vNodes_00 = Map_NodeVecAlloc(100);
  for (local_24 = 0; local_24 < pMan->nOutputs; local_24 = local_24 + 1) {
    Map_MappingDfs_rec((Map_Node_t *)((ulong)pMan->pOutputs[local_24] & 0xfffffffffffffffe),
                       vNodes_00,fCollectEquiv);
  }
  for (local_24 = 0; local_24 < vNodes_00->nSize; local_24 = local_24 + 1) {
    *(uint *)&vNodes_00->pArray[local_24]->field_0x1c =
         *(uint *)&vNodes_00->pArray[local_24]->field_0x1c & 0xfffffffe;
  }
  return vNodes_00;
}

Assistant:

Map_NodeVec_t * Map_MappingDfs( Map_Man_t * pMan, int fCollectEquiv )
{
    Map_NodeVec_t * vNodes;
    int i;
    // perform the traversal
    vNodes = Map_NodeVecAlloc( 100 );
    for ( i = 0; i < pMan->nOutputs; i++ )
        Map_MappingDfs_rec( Map_Regular(pMan->pOutputs[i]), vNodes, fCollectEquiv );
    for ( i = 0; i < vNodes->nSize; i++ )
        vNodes->pArray[i]->fMark0 = 0;
//    for ( i = 0; i < pMan->nOutputs; i++ )
//        Map_MappingUnmark_rec( Map_Regular(pMan->pOutputs[i]) );
    return vNodes;
}